

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O1

ssize_t __thiscall
jaegertracing::thrift::BaggageRestrictionManager_getBaggageRestrictions_result::write
          (BaggageRestrictionManager_getBaggageRestrictions_result *this,int __fd,void *__buf,
          size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  pointer pBVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(code **)(*plVar4 + 0x20))
                    (plVar4,"BaggageRestrictionManager_getBaggageRestrictions_result");
  if (((byte)this->__isset & 1) != 0) {
    iVar2 = (**(code **)(*plVar4 + 0x30))(plVar4,"success",0xf,0);
    iVar3 = (**(code **)(*plVar4 + 0x58))
                      (plVar4,0xc,
                       (int)((ulong)((long)(this->success).
                                           super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->success).
                                          super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x55555555);
    iVar3 = iVar3 + iVar2 + iVar1;
    for (pBVar5 = (this->success).
                  super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar5 != (this->success).
                  super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pBVar5 = pBVar5 + 1) {
      iVar1 = (**(code **)(*(long *)pBVar5 + 0x18))(pBVar5,plVar4);
      iVar3 = iVar3 + iVar1;
    }
    iVar1 = (**(code **)(*plVar4 + 0x60))(plVar4);
    iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
    iVar1 = iVar2 + iVar1 + iVar3;
  }
  iVar2 = (**(code **)(*plVar4 + 0x40))(plVar4);
  iVar3 = (**(code **)(*plVar4 + 0x28))(plVar4);
  return (ulong)(uint)(iVar3 + iVar2 + iVar1);
}

Assistant:

uint32_t BaggageRestrictionManager_getBaggageRestrictions_result::write(::apache::thrift::protocol::TProtocol* oprot) const {

  uint32_t xfer = 0;

  xfer += oprot->writeStructBegin("BaggageRestrictionManager_getBaggageRestrictions_result");

  if (this->__isset.success) {
    xfer += oprot->writeFieldBegin("success", ::apache::thrift::protocol::T_LIST, 0);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->success.size()));
      std::vector<BaggageRestriction> ::const_iterator _iter7;
      for (_iter7 = this->success.begin(); _iter7 != this->success.end(); ++_iter7)
      {
        xfer += (*_iter7).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}